

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<char16_t> * __thiscall
kj::ArrayBuilder<char16_t>::operator=(ArrayBuilder<char16_t> *this,ArrayBuilder<char16_t> *other)

{
  ArrayBuilder<char16_t> *other_local;
  ArrayBuilder<char16_t> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (char16_t *)0x0;
  other->pos = (RemoveConst<char16_t> *)0x0;
  other->endPtr = (char16_t *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }